

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O3

int runRansac(vector<Point2D,_std::allocator<Point2D>_> *dataSets,int n,int maxIterations,
             double sigma,int d,LineModel *best_model,
             set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             *inlier_sets,double *best_error)

{
  unsigned_long *puVar1;
  double *pdVar2;
  pointer pPVar3;
  _Base_ptr p_Var4;
  LineModel *pLVar5;
  result_type rVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  pointer puVar11;
  double dVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  uniform_int_distribution<int> dist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> consensus_set;
  vector<unsigned_long,_std::allocator<unsigned_long>_> availableIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allIndices;
  vector<Point2D,_std::allocator<Point2D>_> pts;
  default_random_engine rng;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  minSets;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> maxInliers_set;
  set<int,_std::less<int>,_std::allocator<int>_> maybe_inliers;
  allocator_type local_1e1;
  double local_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  ulong local_1b8;
  int local_1ac;
  double local_1a8;
  ulong local_1a0;
  ulong local_198;
  uniform_int_distribution<int> local_190;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  undefined8 local_118;
  undefined8 uStack_110;
  vector<Point2D,_std::allocator<Point2D>_> local_108;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_e8;
  LineModel *local_e0;
  double local_d8;
  double local_d0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_c8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_a8;
  double local_78;
  double dStack_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_1d8 = (double)CONCAT44(local_1d8._4_4_,maxIterations);
  uVar13 = (ulong)((long)(dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 4;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  *best_error = 1.79769313486232e+308;
  local_1c8 = sigma;
  local_1ac = d;
  local_e8 = &inlier_sets->_M_t;
  local_e0 = best_model;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar7 = time((time_t *)0x0);
  local_c8._M_x = uVar7 % 0x7fffffff + (ulong)(uVar7 % 0x7fffffff == 0);
  uVar10 = (uint)uVar13;
  local_190._M_param._M_b = uVar10 - 1;
  local_190._M_param._M_a = 0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_138,(long)(int)uVar10);
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = uVar13;
  if (0 < (int)uVar10) {
    puVar11 = (pointer)0x0;
    do {
      local_188._M_impl._0_8_ = puVar11;
      if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_138,
                   (iterator)
                   local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_188);
      }
      else {
        *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)puVar11;
        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar11 = (pointer)((long)puVar11 + 1);
    } while ((pointer)(ulong)(uVar10 & 0x7fffffff) != puVar11);
  }
  local_1e0 = (double)(long)n;
  local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             (size_type)local_1e0,(value_type *)&local_108,(allocator_type *)&local_198);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_c0,(long)local_1d8._0_4_,(value_type *)&local_188,&local_1e1);
  if ((pointer)local_188._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_188._M_impl._0_8_);
  }
  local_1a0 = (ulong)local_1d8 & 0xffffffff;
  if (0 < local_1d8._0_4_) {
    uVar7 = 0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_158,&local_138);
      if (n != 0) {
        dVar12 = 0.0;
        do {
          rVar6 = std::uniform_int_distribution<int>::operator()
                            (&local_190,&local_c8,&local_190._M_param);
          local_c0.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar7].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(long)dVar12] =
               (long)(int)local_158.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[rVar6];
          puVar1 = local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[rVar6] = *puVar1;
          dVar12 = (double)((long)dVar12 + 1);
        } while (local_1e0 != dVar12);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_1a0);
  }
  local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Point2D,_std::allocator<Point2D>_>::reserve(&local_108,(size_type)local_1e0);
  if (0 < local_1d8._0_4_) {
    p_Var4 = (_Base_ptr)((long)&local_188 + 8);
    local_1a8 = local_1c8 * 3.841 * local_1c8;
    uVar10 = (uint)local_1b8;
    local_d8 = SQRT(local_1a8);
    uVar7 = 0;
    do {
      if (n != 0) {
        lVar8 = 0;
        dVar12 = local_1e0;
        do {
          pPVar3 = (dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                   super__Vector_impl_data._M_start +
                   *(int *)((long)local_c0.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar8);
          dVar17 = pPVar3->y;
          pdVar2 = (double *)
                   ((long)&(local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                            super__Vector_impl_data._M_start)->x + lVar8 * 2);
          *pdVar2 = pPVar3->x;
          pdVar2[1] = dVar17;
          lVar8 = lVar8 + 8;
          dVar12 = (double)((long)dVar12 + -1);
        } while (dVar12 != 0.0);
      }
      local_1c8 = local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                  super__Vector_impl_data._M_start[1].y;
      dVar12 = (local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_start)->x;
      local_1d8 = (local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_start)->y;
      dStack_1d0 = local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_start[1].x;
      local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar14 = SUB84(local_d8,0);
      uVar15 = (undefined4)((ulong)local_d8 >> 0x20);
      uVar18 = SUB84(dVar12,0);
      uVar19 = (int)((ulong)dVar12 >> 0x20);
      local_188._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
      local_188._M_impl.super__Rb_tree_header._M_header._M_right = p_Var4;
      if (local_1a8 < 0.0) {
        dStack_1c0 = 0.0;
        uStack_110 = 0;
        local_118 = dVar12;
        dVar12 = sqrt(local_1a8);
        uVar14 = SUB84(dVar12,0);
        uVar15 = (undefined4)((ulong)dVar12 >> 0x20);
        uVar18 = (undefined4)local_118;
        uVar19 = local_118._4_4_;
      }
      dVar17 = local_1c8 - local_1d8;
      dVar12 = (double)CONCAT44(uVar19,uVar18) - dStack_1d0;
      local_1d8 = (dStack_1d0 - (double)CONCAT44(uVar19,uVar18)) * local_1c8 +
                  (local_1d8 - local_1c8) * dStack_1d0;
      local_1c8 = dVar17;
      dStack_1c0 = dVar12;
      if (0 < (int)local_1b8) {
        dVar17 = SQRT(dVar17 * dVar17 + dVar12 * dVar12);
        lVar8 = 8;
        uVar13 = 0;
        local_118 = (double)CONCAT44(uVar15,uVar14);
        local_d0 = dVar17;
        local_78 = dVar12;
        dStack_70 = dVar12;
        do {
          pPVar3 = (dataSets->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar16 = ABS(*(double *)((long)pPVar3 + lVar8 + -8) * local_1c8 +
                       *(double *)((long)&pPVar3->x + lVar8) * dVar12 + local_1d8) / dVar17;
          if (dVar16 <= (double)CONCAT44(uVar15,uVar14) && (double)CONCAT44(uVar15,uVar14) != dVar16
             ) {
            local_198 = uVar13;
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_188,&local_198);
            uVar14 = SUB84(local_118,0);
            uVar15 = (undefined4)((ulong)local_118 >> 0x20);
            dVar12 = local_78;
            dVar17 = local_d0;
          }
          uVar13 = uVar13 + 1;
          lVar8 = lVar8 + 0x10;
        } while ((uVar10 & 0x7fffffff) != uVar13);
      }
      if (local_a8._M_impl.super__Rb_tree_header._M_node_count <
          local_188._M_impl.super__Rb_tree_header._M_node_count) {
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=(&local_a8,&local_188);
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_188);
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_1a0);
  }
  pLVar5 = local_e0;
  iVar9 = 0;
  if (((ulong)(long)local_1ac < local_a8._M_impl.super__Rb_tree_header._M_node_count) &&
     (dVar12 = LineModel::estimateModel
                         (local_e0,dataSets,
                          (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&local_a8), iVar9 = 0, *best_error <= dVar12 && dVar12 != *best_error))
  {
    pLVar5->A_ = local_1c8;
    pLVar5->B_ = dStack_1c0;
    pLVar5->C_ = local_1d8;
    local_1e0 = dVar12;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operator=(local_e8,&local_a8);
    *best_error = local_1e0;
    iVar9 = 1;
  }
  if (local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_c0);
  if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return iVar9;
}

Assistant:

int runRansac(vector<Point2D>& dataSets, int n, int maxIterations, double sigma,int d,
		LineModel& best_model, set<size_t>& inlier_sets, double& best_error) {


		int isFound = 0;           //算法成功的标志
		int N = dataSets.size();
		set<int> maybe_inliers;    //初始随机选取的点（的索引值）
		LineModel currentModel;
		set<size_t> maxInliers_set;  //最大内点集
		best_error = 1.7976931348623158e+308;
		default_random_engine rng(time(NULL));     //随机数生成器
		uniform_int_distribution<int> dist(0, N - 1);  //采用均匀分布



	     //1. 新建一个容器allIndices，生成0到N-1的数作为点的索引
		vector<size_t> allIndices;
		allIndices.reserve(N);
		vector<size_t> availableIndices;

		for (int i = 0; i < N; i++)
		{
			allIndices.push_back(i);
		}


	     //2.这个点集是用来计算线性模型的所需的最小点集
		vector< vector<size_t> > minSets = vector< vector<size_t> >(maxIterations, vector<size_t>(n, 0));
		//随机选点，注意避免重复选取同一个点
		for (int it = 0; it < maxIterations; it++)
		{
			availableIndices = allIndices;
			for (size_t j = 0; j < n; j++)
			{
				// 产生0到N-1的随机数
				int randi = dist(rng);
				// idx表示哪一个索引对应的点被选中
				int idx = availableIndices[randi];

				minSets[it][j] = idx;
				//cout << "idx:" << idx << endl;
				// randi对应的索引已经被选过了，从容器中删除
				// randi对应的索引用最后一个元素替换，并删掉最后一个元素
				availableIndices[randi] = availableIndices.back();
				availableIndices.pop_back();
			}
		}


		//3.主循环程序，求解最大的一致点集
		vector<Point2D> pts;
		pts.reserve(n);
		for (int it = 0; it < maxIterations; it++)
		{

			for (size_t j = 0; j < n; j++)
			{
				int idx = minSets[it][j];

				pts[j] = dataSets[idx];

			}

			//cout << pts[0].x << endl << pts[1].x << endl;
			//根据随机到的两个点计算直线的模型
			currentModel.FindLineModel(pts[0],pts[1]);  

			//currentModel.printLineParam();
			set<size_t> consensus_set;        //选取模型后，根据误差阈值t选取的内点(的索引值)

			//根据初始模型和阈值t选择内点  
			// 基于卡方检验计算出的阈值
			const double th =sqrt(3.841*sigma*sigma);
			double current_distance_error = 0.0 ;
			double distance_error = 0.0;
			for (int i = 0; i < N; i++) 
			{
				current_distance_error= currentModel.computeDistance(dataSets[i]);
				if (current_distance_error < th) {
					consensus_set.insert(i);
				}

			}

			if (consensus_set.size() > maxInliers_set.size()) {
				maxInliers_set = consensus_set;
			}
		}

		//4.根据全部的内点重新计算模型
	        //重新在内点集上找一个误差最小的模型
		if (maxInliers_set.size() > d) {
			double current_distance_error = best_model.estimateModel(dataSets, maxInliers_set);
			//若当前模型更好，则更新输出量
			if (best_error < current_distance_error) {
				best_model = currentModel;
				inlier_sets = maxInliers_set;
				best_error = current_distance_error;
				isFound = 1;
			}
		}
		return isFound;
	}